

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.h
# Opt level: O3

void __thiscall
Minisat::DoubleOption::printOptions(DoubleOption *this,FILE *pcsFile,int granularity)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  bool bVar5;
  bool bVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double local_50;
  double local_40;
  
  pcVar4 = strstr((this->super_Option).name,"debug");
  if (((pcVar4 != (char *)0x0) ||
      (pcVar4 = strstr((this->super_Option).description,"debug"), pcVar4 != (char *)0x0)) ||
     (iVar3 = (*(this->super_Option)._vptr_Option[10])(this), (char)iVar3 == '\0')) {
    return;
  }
  dVar11 = 0.0;
  local_40 = 0.0;
  if ((this->range).begin_inclusive == false) {
    local_40 = 0.0001;
  }
  if ((this->range).end_inclusive == false) {
    dVar11 = 0.0001;
  }
  dVar7 = (this->range).end;
  if (dVar7 < INFINITY) {
    local_50 = dVar7 - dVar11;
  }
  else {
    local_50 = 1000000.0;
    if (1000000.0 < this->defaultValue) {
      local_50 = this->defaultValue;
    }
  }
  if (granularity == 0) {
    local_40 = local_40 + (this->range).begin;
    if ((0.0 < local_40) || (dVar7 < dVar11)) {
      pcVar4 = "%s  [%lf,%lf] [%lf]l   # %s\n";
    }
    else {
      pcVar4 = "%s  [%lf,%lf] [%lf]    # %s\n";
    }
    fprintf((FILE *)pcsFile,pcVar4,local_40,local_50,this->value,(this->super_Option).name,
            (this->super_Option).description);
    return;
  }
  fprintf((FILE *)pcsFile,"%s  {",(this->super_Option).name);
  if ((granularity < 2) || (dVar11 = (this->range).begin + local_40, local_50 < dVar11)) {
    fprintf((FILE *)pcsFile,",%.4lf",this->value);
  }
  else {
    dVar7 = local_50 - dVar11;
    bVar1 = false;
    bVar2 = false;
    do {
      bVar5 = bVar2;
      bVar6 = bVar1;
      dVar8 = (this->range).begin + local_40;
      if ((dVar11 != dVar8) || (NAN(dVar11) || NAN(dVar8))) {
        fputc(0x2c,(FILE *)pcsFile);
      }
      fprintf((FILE *)pcsFile,"%.4lf",dVar11);
      dVar8 = round(dVar11 * 10000.0);
      dVar9 = round(this->defaultValue * 10000.0);
      dVar10 = round(this->value * 10000.0);
      dVar11 = dVar11 + dVar7 / (double)(granularity + -1);
      bVar1 = (bool)(bVar6 | dVar8 == dVar10);
      bVar2 = (bool)(bVar5 | dVar8 == dVar9);
    } while (dVar11 <= local_50);
    if (!bVar6 && dVar8 != dVar10) {
      fprintf((FILE *)pcsFile,",%.4lf",this->value);
    }
    if (bVar5 || dVar8 == dVar9) goto LAB_0011f69b;
  }
  dVar11 = this->defaultValue;
  dVar7 = round(dVar11 * 10000.0);
  dVar8 = round(this->value * 10000.0);
  if ((dVar7 != dVar8) || (NAN(dVar7) || NAN(dVar8))) {
    fprintf((FILE *)pcsFile,",%.4lf",dVar11);
  }
LAB_0011f69b:
  fprintf((FILE *)pcsFile,"} [%.4lf]    # %s\n",this->value,(this->super_Option).description);
  return;
}

Assistant:

void printOptions(FILE *pcsFile, int granularity)
    {
        if (strstr(name, "debug") != 0 || strstr(description, "debug") != 0) {
            return;
        } // do not print the parameter, if its related to debug output
        if (!wouldPrintOption()) {
            return;
        } // do not print option?

        // print only, if there is a default
        // choose between logarithmic scale and linear scale based on the number of elements in the list - more than 16 elements means it should be log (simple heuristic)
        double badd = 0, esub = 0;
        if (!range.begin_inclusive) {
            badd = 0.0001;
        }
        if (!range.end_inclusive) {
            esub = 0.0001;
        }
        // always logarithmic
        double endValue = range.end == HUGE_VAL ? (defaultValue > 1000000.0 ? defaultValue : 1000000.0) : range.end - esub;
        if (granularity == 0) { // use interval
            if (range.begin + badd > 0 || range.end - esub < 0) {
                fprintf(pcsFile, "%s  [%lf,%lf] [%lf]l   # %s\n", name, range.begin + badd, endValue, value, description);
            } else {
                fprintf(pcsFile, "%s  [%lf,%lf] [%lf]    # %s\n", name, range.begin + badd, endValue, value, description);
            }
        } else {                             // print linear distributed sampling for double option
            fprintf(pcsFile, "%s  {", name); // print name
            bool hitDefault = false;
            bool hitValue = false;
            if (granularity > 1) {
                double diff = (endValue - (range.begin + badd)) / (double)(granularity - 1);
                for (double v = range.begin + badd; v <= endValue; v += diff) {
                    if (v != range.begin + badd) {
                        fprintf(pcsFile, ",");
                    }                             // print comma, if there will be more and we printed one item already
                    fprintf(pcsFile, "%.4lf", v); // print current value
                    if (round(v * 10000) == round(defaultValue * 10000)) {
                        hitDefault = true;
                    } // otherwise we run into precision problems
                    if (round(v * 10000) == round(value * 10000)) {
                        hitValue = true;
                    } // otherwise we run into precision problems
                }
            }
            if (!hitValue) {
                fprintf(pcsFile, ",%.4lf", value);
            } // print current value of option as well!
            if (!hitDefault && round(defaultValue * 10000) != round(value * 10000)) {
                fprintf(pcsFile, ",%.4lf", defaultValue);
            } // print default value of option as well!
            fprintf(pcsFile, "} [%.4lf]    # %s\n", value, description);
        }
    }